

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

double __thiscall Alg::max_cover_topk(Alg *this,int targetSize)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  iterator iVar6;
  uint *puVar7;
  pointer puVar8;
  unsigned_long uVar9;
  pointer pvVar10;
  int iVar11;
  uint uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *nodes;
  ulong uVar13;
  ostream *poVar14;
  long lVar15;
  pointer *ppuVar16;
  ulong *puVar17;
  Alg *pAVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  iterator __begin2;
  uint *puVar22;
  iterator __end2;
  ulong uVar23;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  value_type seed;
  vector<bool,_std::allocator<bool>_> edgeMark;
  Nodelist sortedNode;
  FRset coverage;
  Nodelist degreePosition;
  Nodelist nodePosition;
  RRsets degMap;
  uint local_148;
  allocator_type local_141;
  vector<bool,_std::allocator<bool>_> local_140;
  _Bit_type *local_118;
  int local_10c;
  ulong *local_108;
  double dStack_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  Alg *local_d8;
  unsigned_long local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80;
  double local_68;
  double dStack_60;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_50;
  long local_48;
  long local_40;
  pointer local_38;
  
  local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c8,(ulong)this->__numV,(value_type_conflict2 *)&local_140,
             (allocator_type *)&local_80);
  uVar13 = (ulong)this->__numV;
  if (uVar13 == 0) {
    uVar23 = 0;
  }
  else {
    ppuVar16 = (pointer *)
               ((long)&(this->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar23 = 0;
    do {
      uVar19 = (long)*ppuVar16 - (long)((_Vector_impl_data *)(ppuVar16 + -1))->_M_start >> 3;
      if (uVar23 < uVar19) {
        uVar23 = uVar19;
      }
      ppuVar16 = ppuVar16 + -3;
      local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13 - 1] = uVar19;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_80,uVar23 + 1,(allocator_type *)&local_140);
  uVar12 = this->__numV - 1;
  local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar12);
  if (this->__numV != 0) {
    do {
      this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                (local_80.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12]);
      iVar6._M_current = *(uint **)(this_00 + 8);
      if (iVar6._M_current == *(uint **)(this_00 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_00,iVar6,(uint *)&local_140);
      }
      else {
        *iVar6._M_current = uVar12;
        *(uint **)(this_00 + 8) = iVar6._M_current + 1;
      }
      bVar24 = (int)local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
      uVar12 = (int)local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar12);
    } while (bVar24);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_f0,(ulong)this->__numV,(allocator_type *)&local_140);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_98,(ulong)this->__numV,(allocator_type *)&local_140);
  local_d8 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,uVar23 + 2,(allocator_type *)&local_140);
  pAVar18 = local_d8;
  if (local_80.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar12 = 0;
    lVar20 = 0;
    do {
      puVar22 = ((local_80.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 = ((local_80.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar20 + 1] =
           (int)((ulong)((long)puVar7 - (long)puVar22) >> 2) +
           local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar20];
      for (; puVar7 != puVar22; puVar22 = puVar22 + 1) {
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[*puVar22] = uVar12;
        uVar13 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] = *puVar22;
      }
      lVar20 = lVar20 + 1;
      local_80.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_80.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
    } while (local_80.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_80.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_148 = local_148 & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_140,local_d8->__numRRsets,(bool *)&local_148,&local_141);
  if (uVar23 + 1 == 0) {
    lVar20 = 0;
  }
  else {
    lVar20 = 0;
    do {
      if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar23] <= pAVar18->__numV - targetSize) {
        lVar20 = lVar20 + uVar23 * ((targetSize - pAVar18->__numV) +
                                   local_b0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar23 + 1]);
        break;
      }
      lVar20 = lVar20 + (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar23 + 1] -
                        local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar23]) * uVar23;
      bVar24 = uVar23 != 0;
      uVar23 = uVar23 - 1;
    } while (bVar24);
  }
  auVar26._8_4_ = (int)((ulong)lVar20 >> 0x20);
  auVar26._0_8_ = lVar20;
  auVar26._12_4_ = 0x45300000;
  pAVar18->__boundMin =
       (auVar26._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
  puVar8 = (pAVar18->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pAVar18->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar8) {
    (pAVar18->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8;
  }
  if (targetSize == 0) {
    local_108 = (ulong *)0x0;
    dStack_100 = 0.0;
  }
  else {
    local_50 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar18->__vecSeed;
    local_48 = (long)targetSize;
    lVar15 = 0;
    local_68 = -3.11261356879985e-322;
    iVar11 = targetSize;
    do {
      local_10c = iVar11;
      local_148 = local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
      local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      uVar13 = ((long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) - local_48;
      uVar9 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13]];
      local_d0 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[local_148];
      iVar6._M_current =
           (pAVar18->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_40 = lVar15;
      if (iVar6._M_current ==
          (pAVar18->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_50,iVar6,&local_148);
      }
      else {
        *iVar6._M_current = local_148;
        (pAVar18->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      lVar20 = (lVar20 + uVar9) - local_d0;
      uVar23 = (ulong)local_148;
      local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar23] = 0;
      pvVar10 = (pAVar18->__hyperG)._FRsets.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar17 = pvVar10[uVar23].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_108 = *(pointer *)
                   ((long)&pvVar10[uVar23].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 8);
      if (puVar17 != local_108) {
        local_118 = local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        local_38 = (pAVar18->__hyperG)._RRsets.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar23 = *puVar17;
          uVar19 = uVar23 + 0x3f;
          if (-1 < (long)uVar23) {
            uVar19 = uVar23;
          }
          uVar21 = (ulong)((uVar23 & (ulong)local_68) < 0x8000000000000001);
          if ((local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[((long)uVar19 >> 6) + (uVar21 - 1)] >>
               (uVar23 & 0x3f) & 1) == 0) {
            local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[((long)uVar19 >> 6) + (uVar21 - 1)] =
                 local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar19 >> 6) + (uVar21 - 1)] | 1L << ((byte)uVar23 & 0x3f);
            puVar7 = *(pointer *)
                      ((long)&local_38[uVar23].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8);
            for (puVar22 = local_38[uVar23].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; puVar22 != puVar7;
                puVar22 = puVar22 + 1) {
              uVar12 = *puVar22;
              uVar9 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar12];
              if (uVar9 != 0) {
                uVar2 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar12];
                uVar3 = local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9];
                uVar23 = (ulong)uVar3;
                uVar4 = local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar23];
                uVar5 = local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar2];
                local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2] = uVar4;
                local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar23] = uVar5;
                local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12] = uVar3;
                local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4] = uVar2;
                local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9] =
                     local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar9] + 1;
                local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12] = uVar9 - 1;
                lVar20 = lVar20 + -1 + (ulong)(uVar23 < uVar13);
              }
            }
          }
          puVar17 = puVar17 + 1;
        } while (puVar17 != local_108);
      }
      lVar15 = local_40 + local_d0;
      lVar1 = lVar20 + lVar15;
      auVar29._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar29._0_8_ = lVar1;
      auVar29._12_4_ = 0x45300000;
      dVar25 = (auVar29._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
      local_d8->__boundLast = dVar25;
      if (dVar25 < local_d8->__boundMin) {
        local_d8->__boundMin = dVar25;
      }
      pAVar18 = local_d8;
      iVar11 = local_10c + -1;
    } while (local_10c + -1 != 0);
    auVar27._8_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar27._0_8_ = lVar15;
    auVar27._12_4_ = 0x45300000;
    dStack_100 = auVar27._8_8_ - 1.9342813113834067e+25;
    local_108 = (ulong *)(dStack_100 +
                         ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0));
  }
  local_118 = (_Bit_type *)(double)pAVar18->__numV;
  auVar28._0_8_ = (double)CONCAT44(0x43300000,(int)pAVar18->__numRRsets);
  auVar28._8_4_ = (int)(pAVar18->__numRRsets >> 0x20);
  auVar28._12_4_ = 0x45300000;
  dStack_60 = auVar28._8_8_ - 1.9342813113834067e+25;
  local_68 = dStack_60 + (auVar28._0_8_ - 4503599627370496.0);
  pAVar18->__boundMin = pAVar18->__boundMin * ((double)local_118 / local_68);
  pAVar18->__boundLast = ((double)local_118 / local_68) * pAVar18->__boundLast;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-topk] influence: ",0x1e);
  local_108 = (ulong *)(((double)local_108 * (double)local_118) / local_68);
  poVar14 = std::ostream::_M_insert<double>((double)local_108);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,", min-bound: ",0xd);
  poVar14 = std::ostream::_M_insert<double>(pAVar18->__boundMin);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,", last-bound: ",0xe);
  poVar14 = std::ostream::_M_insert<double>(pAVar18->__boundLast);
  local_148 = CONCAT31(local_148._1_3_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)&local_148,1);
  if (local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_80);
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (double)local_108;
}

Assistant:

double Alg::max_cover_topk(const int targetSize)
{
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;)
    {
        const auto deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) maxDeg = deg;
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;)
    {
        //if (coverage[i] == 0) continue;
        degMap[coverage[i]].push_back(i);
    }
    Nodelist sortedNode(__numV); // sortedNode: record the sorted nodes in ascending order of degree
    Nodelist nodePosition(__numV); // nodePosition: record the position of each node in the sortedNode
    Nodelist degreePosition(maxDeg + 2); // degreePosition: the start position of each degree in sortedNode
    uint32_t idxSort = 0;
    size_t idxDegree = 0;
    for (auto& nodes : degMap)
    {
        degreePosition[idxDegree + 1] = degreePosition[idxDegree] + (uint32_t)nodes.size();
        idxDegree++;
        for (auto& node : nodes)
        {
            nodePosition[node] = idxSort;
            sortedNode[idxSort++] = node;
        }
    }
    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);
    // record the total of top-k marginal gains
    size_t sumTopk = 0;
    for (auto deg = maxDeg + 1; deg--;)
    {
        if (degreePosition[deg] <= __numV - targetSize)
        {
            sumTopk += deg * (degreePosition[deg + 1] - (__numV - targetSize));
            break;
        }
        sumTopk += deg * (degreePosition[deg + 1] - degreePosition[deg]);
    }
    __boundMin = 1.0 * sumTopk;
    __vecSeed.clear();
    size_t sumInf = 0;
    /*
    * sortedNode: position -> node
    * nodePosition: node -> position
    * degreePosition: degree -> position (start position of this degree)
    * coverage: node -> degree
    * e.g., swap the position of a node with the start position of its degree
    * swap(sortedNode[nodePosition[node]], sortedNode[degreePosition[coverage[node]]])
    */
    for (auto k = targetSize; k--;)
    {
        const auto seed = sortedNode.back();
        sortedNode.pop_back();
        const auto newNumV = sortedNode.size();
        sumTopk += coverage[sortedNode[newNumV - targetSize]] - coverage[seed];
        sumInf += coverage[seed];
        __vecSeed.push_back(seed);
        coverage[seed] = 0;
        for (auto edgeIdx : __hyperG._FRsets[seed])
        {
            if (edgeMark[edgeIdx]) continue;
            edgeMark[edgeIdx] = true;
            for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
            {
                if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                const auto currPos = nodePosition[nodeIdx]; // The current position
                const auto currDeg = coverage[nodeIdx]; // The current degree
                const auto startPos = degreePosition[currDeg]; // The start position of this degree
                const auto startNode = sortedNode[startPos]; // The node with the start position
                // Swap this node to the start position with the same degree, and update their positions in nodePosition
                std::swap(sortedNode[currPos], sortedNode[startPos]);
                nodePosition[nodeIdx] = startPos;
                nodePosition[startNode] = currPos;
                // Increase the start position of this degree by 1, and decrease the degree of this node by 1
                degreePosition[currDeg]++;
                coverage[nodeIdx]--;
                // If the start position of this degree is in top-k, reduce topk by 1
                if (startPos >= newNumV - targetSize) sumTopk--;
            }
        }
        __boundLast = 1.0 * (sumInf + sumTopk);
        if (__boundMin > __boundLast) __boundMin = __boundLast;
    }
    __boundMin *= 1.0 * __numV / __numRRsets;
    __boundLast *= 1.0 * __numV / __numRRsets;
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << "  >>>[greedy-topk] influence: " << finalInf << ", min-bound: " << __boundMin <<
              ", last-bound: " << __boundLast << '\n';
    return finalInf;
}